

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O0

Node * __thiscall
TMap<FName,_double,_THashTraits<FName>,_TValueTraits<double>_>::FindKey
          (TMap<FName,_double,_THashTraits<FName>,_TValueTraits<double>_> *this,FName *key)

{
  bool bVar1;
  int iVar2;
  bool bVar3;
  FName local_34;
  FName local_30;
  FName local_2c;
  Node *local_28;
  Node *n;
  FName *pFStack_18;
  THashTraits<FName> Traits;
  FName *key_local;
  TMap<FName,_double,_THashTraits<FName>,_TValueTraits<double>_> *this_local;
  
  pFStack_18 = key;
  FName::FName(&local_2c,key);
  local_28 = MainPosition(this,&local_2c);
  while( true ) {
    bVar3 = false;
    if (local_28 != (Node *)0x0) {
      bVar1 = Node::IsNil(local_28);
      bVar3 = false;
      if (!bVar1) {
        FName::FName(&local_30,&(local_28->Pair).Key);
        FName::FName(&local_34,key);
        iVar2 = THashTraits<FName>::Compare
                          ((THashTraits<FName> *)((long)&n + 7),&local_30,&local_34);
        bVar3 = iVar2 != 0;
      }
    }
    if (!bVar3) break;
    local_28 = local_28->Next;
  }
  if ((local_28 != (Node *)0x0) && (bVar3 = Node::IsNil(local_28), !bVar3)) {
    return local_28;
  }
  return (Node *)0x0;
}

Assistant:

Node *FindKey(const KT key)
	{
		HashTraits Traits;
		Node *n = MainPosition(key);
		while (n != NULL && !n->IsNil() && Traits.Compare(n->Pair.Key, key))
		{
			n = n->Next;
		}
		return n == NULL || n->IsNil() ? NULL : n;
	}